

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int checkTreePage(IntegrityCk *pCheck,Pgno iPage,i64 *piMinKey,i64 maxKey)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  char *pcVar7;
  BtShared *pBt;
  u8 *puVar8;
  bool bVar9;
  bool bVar10;
  Pgno PVar11;
  int iVar12;
  MemPage *pPage_00;
  ushort uVar13;
  u16 uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  u8 uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  ushort *puVar26;
  char *zFormat;
  long lVar27;
  uint *puVar28;
  ulong uVar29;
  int iVar30;
  uint *puVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  long in_FS_OFFSET;
  MemPage *pPage;
  undefined1 local_68 [20];
  ushort uStack_54;
  ushort uStack_52;
  MemPage *local_48;
  i64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (MemPage *)0x0;
  pcVar7 = pCheck->zPfx;
  PVar11 = pCheck->v1;
  iVar12 = pCheck->v2;
  local_40 = maxKey;
  checkProgress(pCheck);
  iVar15 = -1;
  iVar30 = 0;
  if (pCheck->mxErr == 0) {
    uVar19 = '\0';
  }
  else {
    if (iPage == 0) goto LAB_0015d5de;
    pBt = pCheck->pBt;
    uVar34 = pBt->usableSize;
    iVar15 = checkRef(pCheck,iPage);
    iVar30 = 0;
    if (iVar15 != 0) goto LAB_0015d5de;
    pCheck->zPfx = "Tree %u page %u: ";
    pCheck->v1 = iPage;
    uVar16 = btreeGetPage(pBt,iPage,&local_48,0);
    pPage_00 = local_48;
    if (uVar16 == 0) {
      uVar19 = local_48->isInit;
      local_48->isInit = '\0';
      uVar16 = btreeInitPage(local_48);
      iVar15 = -1;
      if (uVar16 == 0) {
        uVar16 = btreeComputeFreeSpace(pPage_00);
        if (uVar16 == 0) {
          puVar8 = pPage_00->aData;
          uVar22 = (ulong)pPage_00->hdrOffset;
          pCheck->zPfx = "Tree %u page %u cell %u: ";
          bVar1 = puVar8[uVar22 + 5];
          bVar2 = puVar8[uVar22 + 6];
          bVar3 = puVar8[uVar22 + 3];
          bVar4 = puVar8[uVar22 + 4];
          uVar16 = (uint)bVar3 * 0x100 + (uint)bVar4;
          bVar5 = pPage_00->leaf;
          if ((bVar5 != 0) || (pPage_00->intKey == '\0')) {
            pCheck->nRow = pCheck->nRow + (ulong)uVar16;
          }
          lVar27 = uVar22 - (uint)bVar5 * 4;
          if (bVar5 == 0) {
            uVar25 = *(uint *)(puVar8 + uVar22 + 8);
            uVar25 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                     uVar25 << 0x18;
            if (pBt->autoVacuum != '\0') {
              pCheck->zPfx = "Tree %u page %u right child: ";
              checkPtrmap(pCheck,uVar25,'\x05',iPage);
            }
            iVar15 = checkTreePage(pCheck,uVar25,&local_40,maxKey);
            bVar9 = false;
            puVar31 = (uint *)0x0;
          }
          else {
            puVar31 = pCheck->heap;
            *puVar31 = 0;
            iVar15 = -1;
            bVar9 = true;
          }
          uVar25 = ((uint)bVar1 * 0x100 + (uint)bVar2) - 1 & 0xffff;
          if (uVar16 == 0) {
            bVar10 = false;
          }
          else {
            puVar26 = (ushort *)(puVar8 + (int)((int)lVar27 + uVar16 * 2 + 10));
            uVar24 = uVar34 - 4;
            bVar10 = true;
            uVar32 = uVar16;
            do {
              uVar32 = uVar32 - 1;
              if (pCheck->mxErr == 0) break;
              stack0xffffffffffffffa8 = &DAT_aaaaaaaaaaaaaaaa;
              local_68._0_4_ = 0xaaaaaaaa;
              local_68._4_4_ = 0xaaaaaaaa;
              local_68._8_4_ = 0xaaaaaaaa;
              local_68._12_4_ = 0xaaaaaaaa;
              pCheck->v2 = uVar32;
              uVar13 = *puVar26 << 8 | *puVar26 >> 8;
              uVar33 = (uint)uVar13;
              if (uVar24 < uVar13 || uVar13 <= uVar25) {
                bVar10 = false;
                checkAppendMsg(pCheck,"Offset %u out of range %u..%u",(ulong)uVar33,
                               (ulong)(uVar25 + 1),(ulong)uVar24);
              }
              else {
                puVar28 = (uint *)(puVar8 + uVar33);
                (*pPage_00->xParseCell)(pPage_00,(u8 *)puVar28,(CellInfo *)local_68);
                if (uVar34 < uStack_52 + uVar33) {
                  bVar10 = false;
                  checkAppendMsg(pCheck,"Extends off end of page");
                }
                else {
                  if (pPage_00->intKey != '\0') {
                    if (bVar9) {
                      if (local_40 < CONCAT44(local_68._4_4_,local_68._0_4_)) {
LAB_0015d914:
                        checkAppendMsg(pCheck,"Rowid %lld out of order",
                                       CONCAT44(local_68._4_4_,local_68._0_4_));
                      }
                    }
                    else if (local_40 <= CONCAT44(local_68._4_4_,local_68._0_4_)) goto LAB_0015d914;
                    local_40 = CONCAT44(local_68._4_4_,local_68._0_4_);
                    bVar9 = false;
                  }
                  if ((uint)uStack_54 < (uint)local_68._16_4_) {
                    iVar30 = local_68._16_4_ + (uVar34 - 5);
                    uVar20 = (uint)uStack_54;
                    uVar21 = *(uint *)((long)puVar28 +
                                      (((ulong)stack0xffffffffffffffa8 >> 0x30) - 4));
                    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                             uVar21 << 0x18;
                    if (pBt->autoVacuum != '\0') {
                      checkPtrmap(pCheck,uVar21,'\x03',iPage);
                    }
                    checkList(pCheck,0,uVar21,(iVar30 - uVar20) / uVar24);
                  }
                  if (pPage_00->leaf == '\0') {
                    uVar33 = *puVar28;
                    uVar33 = uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8 |
                             uVar33 << 0x18;
                    if (pBt->autoVacuum != '\0') {
                      checkPtrmap(pCheck,uVar33,'\x05',iPage);
                    }
                    iVar30 = checkTreePage(pCheck,uVar33,&local_40,local_40);
                    if (iVar30 == iVar15) {
                      bVar9 = false;
                    }
                    else {
                      bVar9 = false;
                      checkAppendMsg(pCheck,"Child page depth differs");
                      iVar15 = iVar30;
                    }
                  }
                  else {
                    uVar21 = *puVar31 + 1;
                    uVar17 = (ulong)uVar21;
                    *puVar31 = uVar21;
                    puVar31[uVar17] = ((uint)uVar13 + (uint)uStack_52) - 1 | uVar33 << 0x10;
                    if (1 < uVar21) {
                      do {
                        uVar18 = uVar17 >> 1;
                        uVar33 = puVar31[uVar18];
                        if (uVar33 <= puVar31[uVar17]) break;
                        puVar31[uVar18] = puVar31[uVar17];
                        puVar31[uVar17] = uVar33;
                        uVar33 = (uint)uVar17;
                        uVar17 = uVar18;
                      } while (3 < uVar33);
                    }
                  }
                }
              }
              puVar26 = puVar26 + -1;
            } while (0 < (int)uVar32);
            bVar10 = !bVar10;
          }
          *piMinKey = local_40;
          pCheck->zPfx = (char *)0x0;
          iVar30 = 1;
          if (!bVar10) {
            if (0 < pCheck->mxErr) {
              if (pPage_00->leaf == '\0') {
                puVar31 = pCheck->heap;
                *puVar31 = 0;
                if (uVar16 != 0) {
                  uVar17 = (ulong)CONCAT11(bVar3,bVar4);
                  do {
                    uVar13 = *(ushort *)(puVar8 + uVar17 * 2 + lVar27 + 10) << 8 |
                             *(ushort *)(puVar8 + uVar17 * 2 + lVar27 + 10) >> 8;
                    uVar14 = (*pPage_00->xCellSize)(pPage_00,puVar8 + uVar13);
                    uVar16 = *puVar31 + 1;
                    *puVar31 = uVar16;
                    puVar31[uVar16] = ((uint)uVar13 + (uint)uVar14) - 1 | (uint)uVar13 << 0x10;
                    uVar18 = (ulong)uVar16;
                    if (1 < uVar16) {
                      do {
                        uVar29 = uVar18 >> 1;
                        uVar16 = puVar31[uVar29];
                        if (uVar16 <= puVar31[uVar18]) break;
                        puVar31[uVar29] = puVar31[uVar18];
                        puVar31[uVar18] = uVar16;
                        uVar16 = (uint)uVar18;
                        uVar18 = uVar29;
                      } while (3 < uVar16);
                    }
                    bVar9 = 1 < (long)uVar17;
                    uVar17 = uVar17 - 1;
                  } while (bVar9);
                }
              }
              for (uVar13 = *(ushort *)(puVar8 + uVar22 + 1) << 8 |
                            *(ushort *)(puVar8 + uVar22 + 1) >> 8; uVar13 != 0;
                  uVar13 = *(ushort *)(puVar8 + uVar13) << 8 | *(ushort *)(puVar8 + uVar13) >> 8) {
                uVar6 = *(ushort *)(puVar8 + (ulong)uVar13 + 2);
                uVar16 = *puVar31 + 1;
                *puVar31 = uVar16;
                puVar31[uVar16] =
                     ((uint)(ushort)(uVar6 << 8 | uVar6 >> 8) + (uint)uVar13) - 1 |
                     (uint)uVar13 << 0x10;
                uVar17 = (ulong)uVar16;
                if (1 < uVar16) {
                  do {
                    uVar18 = uVar17 >> 1;
                    uVar16 = puVar31[uVar18];
                    if (uVar16 <= puVar31[uVar17]) break;
                    puVar31[uVar18] = puVar31[uVar17];
                    puVar31[uVar17] = uVar16;
                    uVar16 = (uint)uVar17;
                    uVar17 = uVar18;
                  } while (3 < uVar16);
                }
              }
              iVar30 = 0;
              uVar16 = 0xaaaaaaaa;
              do {
                uVar32 = *puVar31;
                uVar17 = (ulong)uVar32;
                if (uVar17 != 0) {
                  uVar16 = puVar31[1];
                  puVar31[1] = puVar31[uVar17];
                  puVar31[uVar17] = 0xffffffff;
                  *puVar31 = uVar32 - 1;
                  if (2 < uVar32) {
                    uVar29 = 2;
                    uVar18 = 1;
                    do {
                      uVar23 = (ulong)((uint)uVar29 | 1);
                      if (puVar31[uVar29] <= puVar31[uVar23]) {
                        uVar23 = uVar29;
                      }
                      uVar32 = puVar31[uVar18];
                      if (uVar32 < puVar31[uVar23]) break;
                      puVar31[uVar18] = puVar31[uVar23];
                      puVar31[uVar23] = uVar32;
                      uVar32 = (int)uVar23 * 2;
                      uVar29 = (ulong)uVar32;
                      uVar18 = uVar23;
                    } while (uVar32 <= *puVar31);
                  }
                }
                if (uVar17 == 0) goto LAB_0015dd1f;
                uVar32 = uVar16 >> 0x10;
                if (uVar32 <= (uVar25 & 0xffff)) goto LAB_0015dcfb;
                iVar30 = iVar30 + uVar32 + ~(uVar25 & 0xffff);
                uVar25 = uVar16;
              } while( true );
            }
            goto LAB_0015dd26;
          }
          goto LAB_0015d5a3;
        }
        zFormat = "free space corruption";
      }
      else {
        zFormat = "btreeInitPage() returns error code %d";
      }
      iVar30 = 0;
      checkAppendMsg(pCheck,zFormat,(ulong)uVar16);
    }
    else {
      checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar16);
      iVar15 = -1;
      if (uVar16 == 0xc0a) {
        pCheck->rc = 7;
      }
      iVar30 = 0;
      uVar19 = '\0';
    }
  }
  goto LAB_0015d5a3;
LAB_0015dcfb:
  checkAppendMsg(pCheck,"Multiple uses for byte %u of page %u",(ulong)uVar32,(ulong)iPage);
LAB_0015dd1f:
  if (*puVar31 == 0) {
    uVar34 = iVar30 + uVar34 + (~uVar25 | 0xffff0000);
    if (uVar34 == puVar8[uVar22 + 7]) {
      iVar30 = 0;
    }
    else {
      iVar30 = 0;
      checkAppendMsg(pCheck,"Fragmentation of %u bytes reported as %u on page %u",(ulong)uVar34,
                     (ulong)puVar8[uVar22 + 7],(ulong)iPage);
    }
  }
  else {
LAB_0015dd26:
    iVar30 = 0;
  }
LAB_0015d5a3:
  if ((char)iVar30 != '\0') {
    local_48->isInit = uVar19;
  }
  if (local_48 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_48->pDbPage);
  }
  pCheck->zPfx = pcVar7;
  pCheck->v1 = PVar11;
  pCheck->v2 = iVar12;
  iVar30 = iVar15 + 1;
LAB_0015d5de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar30;
  }
  __stack_chk_fail();
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  Pgno iPage,           /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  checkProgress(pCheck);
  if( pCheck->mxErr==0 ) goto end_of_check;
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Tree %u page %u: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    if( rc==SQLITE_IOERR_NOMEM ) pCheck->rc = SQLITE_NOMEM;
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  if( (rc = btreeComputeFreeSpace(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );
    checkAppendMsg(pCheck, "free space corruption", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "Tree %u page %u cell %u: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );
  if( pPage->leaf || pPage->intKey==0 ){
    pCheck->nRow += nCell;
  }

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "Tree %u page %u right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %u out of range %u..%u",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      u32 nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    assert( heap!=0 );
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page.
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize ); /* due to btreeComputeFreeSpace() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );     /* Enforced by btreeComputeFreeSpace() */
      assert( (u32)j<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    **
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %u", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %u bytes reported as %u on page %u",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}